

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

void __thiscall OpenMD::FragmentStamp::checkInversions(FragmentStamp *this)

{
  int iVar1;
  int iVar2;
  InversionStamp *pIVar3;
  pointer ppBVar4;
  long lVar5;
  pointer piVar6;
  const_iterator __position;
  bool bVar7;
  int __tmp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  pointer piVar10;
  pointer ppIVar11;
  iterator iVar12;
  ostream *poVar13;
  OpenMDException *pOVar14;
  int iVar15;
  pointer ppIVar16;
  _Head_base<3UL,_int,_false> _Var17;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  long lVar18;
  size_t j;
  ulong uVar19;
  ulong uVar20;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allInversions;
  vector<int,_std::allocator<int>_> satellites;
  tuple<int,_int,_int,_int> inversionTuple;
  int b;
  undefined4 uStack_1fc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1f8;
  ulong local_1e0;
  vector<int,_std::allocator<int>_> inversion;
  _Bind<std::less<int>_(std::_Placeholder<1>,_int)> local_1c0;
  _Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> local_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  uVar20 = 0;
  do {
    ppIVar11 = (this->inversionStamps_).
               super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppIVar16 = (this->inversionStamps_).
               super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppIVar16 - (long)ppIVar11 >> 3) <= uVar20) {
      lVar18 = 0;
      uVar20 = 0;
      while( true ) {
        if ((ulong)((long)ppIVar16 - (long)ppIVar11 >> 3) <= uVar20) {
          uVar20 = 0;
          do {
            if ((ulong)((long)ppIVar16 - (long)ppIVar11 >> 3) <= uVar20) {
              allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &allInversions._M_t._M_impl.super__Rb_tree_header._M_header;
              allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              allInversions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              lVar18 = 0;
              uVar20 = 0;
              allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   allInversions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              while( true ) {
                if ((ulong)((long)ppIVar16 - (long)ppIVar11 >> 3) <= uVar20) {
                  std::
                  _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                  ::~_Rb_tree(&allInversions._M_t);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
                  return;
                }
                lVar5 = *(long *)((long)ppIVar11 + (lVar18 >> 0x1d));
                iVar1 = *(int *)(lVar5 + 0x98);
                std::vector<int,_std::allocator<int>_>::vector
                          (&inversion,(vector<int,_std::allocator<int>_> *)(lVar5 + 0xa0));
                _Var17._M_head_impl =
                     inversion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[2];
                iVar2 = inversion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[1];
                inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl
                     = *inversion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
                iVar15 = iVar2;
                if (_Var17._M_head_impl < iVar2) {
                  iVar15 = _Var17._M_head_impl;
                  _Var17._M_head_impl = iVar2;
                }
                inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Head_base<2UL,_int,_false>._M_head_impl = iVar15;
                if (iVar15 < inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                             super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>
                             ._M_head_impl) {
                  inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                  super__Head_base<2UL,_int,_false>._M_head_impl =
                       inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl;
                  inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                  _M_head_impl = iVar15;
                }
                inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                     (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)_Var17._M_head_impl;
                if (_Var17._M_head_impl <
                    inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                    super__Head_base<2UL,_int,_false>._M_head_impl) {
                  inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                  super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                       (_Head_base<3UL,_int,_false>)
                       (_Head_base<3UL,_int,_false>)
                       inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                       super__Head_base<2UL,_int,_false>._M_head_impl;
                  inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                  super__Head_base<2UL,_int,_false>._M_head_impl = _Var17._M_head_impl;
                }
                inversionTuple.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                super__Head_base<0UL,_int,_false>._M_head_impl = iVar1;
                iVar12 = std::
                         _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                         ::find(&allInversions._M_t,&inversionTuple);
                if ((_Rb_tree_header *)iVar12._M_node !=
                    &allInversions._M_t._M_impl.super__Rb_tree_header) break;
                std::
                _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                          ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                            *)&allInversions,&inversionTuple);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&inversion.super__Vector_base<int,_std::allocator<int>_>);
                uVar20 = uVar20 + 1;
                ppIVar11 = (this->inversionStamps_).
                           super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppIVar16 = (this->inversionStamps_).
                           super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                lVar18 = lVar18 + 0x100000000;
              }
              poVar13 = std::operator<<((ostream *)&oss,"Error in Fragment ");
              std::__cxx11::string::string((string *)&satellites,(string *)&(this->Name).data_);
              poVar13 = std::operator<<(poVar13,(string *)&satellites);
              poVar13 = std::operator<<(poVar13,": ");
              poVar13 = std::operator<<(poVar13,"Inversion");
              containerToString<std::vector<int,std::allocator<int>>>
                        ((string *)&b,(OpenMD *)&inversion,cont_01);
              poVar13 = std::operator<<(poVar13,(string *)&b);
              std::operator<<(poVar13," appears multiple times\n");
              std::__cxx11::string::~string((string *)&b);
              std::__cxx11::string::~string((string *)&satellites);
              pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              OpenMDException::OpenMDException(pOVar14,(string *)&satellites);
              __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
            }
            pIVar3 = ppIVar11[(int)uVar20];
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       &satellites.super__Vector_base<int,_std::allocator<int>_>,
                       &pIVar3->satellites_);
            allInversions._M_t._M_impl._0_4_ = pIVar3->center_;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)
                       &satellites.super__Vector_base<int,_std::allocator<int>_>,
                       (int *)&allInversions);
            allInversions._M_t._M_impl._0_4_ = 0;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&b,
                       (long)(this->rigidBodyStamps_).
                             super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->rigidBodyStamps_).
                             super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3,
                       (value_type_conflict1 *)&allInversions,(allocator_type *)&inversion);
            piVar6 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (piVar10 = satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                piVar10 !=
                satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar10 = piVar10 + 1) {
              iVar1 = piVar6[*piVar10];
              lVar18 = (long)iVar1;
              if ((-1 < lVar18) &&
                 (iVar2 = *(int *)(CONCAT44(uStack_1fc,b) + lVar18 * 4),
                 *(int *)(CONCAT44(uStack_1fc,b) + lVar18 * 4) = iVar2 + 1, 2 < iVar2)) {
                poVar13 = std::operator<<((ostream *)&oss,"Error in Fragment ");
                std::__cxx11::string::string((string *)&allInversions,(string *)&(this->Name).data_)
                ;
                poVar13 = std::operator<<(poVar13,(string *)&allInversions);
                poVar13 = std::operator<<(poVar13,": inversion centered on atom ");
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pIVar3->center_);
                poVar13 = std::operator<<(poVar13," has four atoms that belong to same rigidbody ");
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar1);
                std::operator<<(poVar13,"\n");
                std::__cxx11::string::~string((string *)&allInversions);
                pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
                std::__cxx11::stringbuf::str();
                OpenMDException::OpenMDException(pOVar14,(string *)&allInversions);
                __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
              }
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&b);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&satellites.super__Vector_base<int,_std::allocator<int>_>);
            uVar20 = uVar20 + 1;
            ppIVar11 = (this->inversionStamps_).
                       super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppIVar16 = (this->inversionStamps_).
                       super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          } while( true );
        }
        lVar5 = *(long *)((long)ppIVar11 + (lVar18 >> 0x1d));
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&b,
                   (vector<int,_std::allocator<int>_> *)(lVar5 + 0xa0));
        __position._M_current._4_4_ = uStack_1fc;
        __position._M_current._0_4_ = b;
        allInversions._M_t._M_impl._0_4_ = *(undefined4 *)(lVar5 + 0x98);
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  ((vector<int,_std::allocator<int>_> *)&b,__position,
                   (value_type_conflict1 *)&allInversions);
        _Var8._M_current._4_4_ = uStack_1fc;
        _Var8._M_current._0_4_ = b;
        local_1b8._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>.
        super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
        _M_head_impl = (_Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>)
                       (((long)(this->atomStamps_).
                               super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->atomStamps_).
                               super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) - 1);
        _Var8 = std::
                find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                          (_Var8,local_1f8,&local_1b8);
        _Var9._M_current._4_4_ = uStack_1fc;
        _Var9._M_current._0_4_ = b;
        local_1c0._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_int>.
        super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Tuple_impl<0UL,_std::_Placeholder<1>,_int>)(_Tuple_impl<1UL,_int>)0x0;
        _Var9 = std::
                find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                          (_Var9,local_1f8,&local_1c0);
        if ((_Var8._M_current != local_1f8._M_current) || (_Var9._M_current != local_1f8._M_current)
           ) break;
        bVar7 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                          ((vector<int,_std::allocator<int>_> *)&b);
        if (bVar7) {
          poVar13 = std::operator<<((ostream *)&oss,"Error in Fragment ");
          std::__cxx11::string::string((string *)&allInversions,(string *)&(this->Name).data_);
          poVar13 = std::operator<<(poVar13,(string *)&allInversions);
          poVar13 = std::operator<<(poVar13," : atoms of inversion");
          containerToString<std::vector<int,std::allocator<int>>>
                    ((string *)&satellites,(OpenMD *)&b,cont_00);
          poVar13 = std::operator<<(poVar13,(string *)&satellites);
          std::operator<<(poVar13," have duplicated indices\n");
          std::__cxx11::string::~string((string *)&satellites);
          std::__cxx11::string::~string((string *)&allInversions);
          pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar14,(string *)&allInversions);
          __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&b);
        uVar20 = uVar20 + 1;
        ppIVar11 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppIVar16 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        lVar18 = lVar18 + 0x100000000;
      }
      poVar13 = std::operator<<((ostream *)&oss,"Error in Fragment ");
      std::__cxx11::string::string((string *)&allInversions,(string *)&(this->Name).data_);
      poVar13 = std::operator<<(poVar13,(string *)&allInversions);
      poVar13 = std::operator<<(poVar13,": atoms of inversion");
      containerToString<std::vector<int,std::allocator<int>>>
                ((string *)&satellites,(OpenMD *)&b,cont);
      poVar13 = std::operator<<(poVar13,(string *)&satellites);
      std::operator<<(poVar13," have invalid indices\n");
      std::__cxx11::string::~string((string *)&satellites);
      std::__cxx11::string::~string((string *)&allInversions);
      pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar14,(string *)&allInversions);
      __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    pIVar3 = ppIVar11[(int)uVar20];
    iVar1 = pIVar3->center_;
    satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((long)(pIVar3->satellites_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pIVar3->satellites_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0xc) {
      lVar18 = 0;
      local_1e0 = uVar20;
      for (uVar19 = 0;
          ppBVar4 = (this->bondStamps_).
                    super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar19 < (ulong)((long)(this->bondStamps_).
                                 super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar4 >> 3);
          uVar19 = uVar19 + 1) {
        lVar5 = *(long *)((long)ppBVar4 + (lVar18 >> 0x1d));
        allInversions._M_t._M_impl._0_4_ = *(int *)(lVar5 + 0xa0);
        b = *(int *)(lVar5 + 0xa4);
        if (allInversions._M_t._M_impl._0_4_ == iVar1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &satellites.super__Vector_base<int,_std::allocator<int>_>,&b);
        }
        if (b == iVar1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &satellites.super__Vector_base<int,_std::allocator<int>_>,
                     (value_type_conflict1 *)&allInversions);
        }
        lVar18 = lVar18 + 0x100000000;
      }
      if ((long)satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)satellites.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0xc) {
        poVar13 = std::operator<<((ostream *)&oss,"Error in Fragment ");
        std::__cxx11::string::string((string *)&allInversions,(string *)&(this->Name).data_);
        poVar13 = std::operator<<(poVar13,(string *)&allInversions);
        poVar13 = std::operator<<(poVar13,": found wrong number");
        poVar13 = std::operator<<(poVar13," of bonds for inversion center ");
        std::ostream::operator<<(poVar13,iVar1);
        std::__cxx11::string::~string((string *)&allInversions);
        pOVar14 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar14,(string *)&allInversions);
        __cxa_throw(pOVar14,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      uVar20 = local_1e0;
      InversionStamp::setSatellites
                (pIVar3,(vector<int,_std::allocator<int>_> *)
                        &satellites.super__Vector_base<int,_std::allocator<int>_>);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&satellites.super__Vector_base<int,_std::allocator<int>_>);
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

void FragmentStamp::checkInversions() {
    std::ostringstream oss;

    // first we automatically find the other three atoms that
    // are satellites of an inversion center:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int center                     = inversionStamp->getCenter();
      std::vector<int> satellites;

      // Some inversions come pre-programmed with the satellites.  If
      // so, don't add the satellites as they are already there.

      if (inversionStamp->getNSatellites() != 3) {
        for (std::size_t j = 0; j < getNBonds(); ++j) {
          BondStamp* bondStamp = getBondStamp(j);
          int a                = bondStamp->getA();
          int b                = bondStamp->getB();

          if (a == center) { satellites.push_back(b); }
          if (b == center) { satellites.push_back(a); }
        }

        if (satellites.size() == 3) {
          std::sort(satellites.begin(), satellites.end());
          inversionStamp->setSatellites(satellites);
        } else {
          oss << "Error in Fragment " << getName() << ": found wrong number"
              << " of bonds for inversion center " << center;
          throw OpenMDException(oss.str());
        }
      }
    }

    // then we do some sanity checking on the inversions:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);

      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      // add the central atom to the beginning of the list:
      inversionAtoms.insert(inversionAtoms.begin(),
                            inversionStamp->getCenter());

      std::vector<int>::iterator j = std::find_if(
          inversionAtoms.begin(), inversionAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(inversionAtoms.begin(), inversionAtoms.end(),
                       std::bind(std::less<int>(), placeholders::_1, 0));

      if (j != inversionAtoms.end() || k != inversionAtoms.end()) {
        oss << "Error in Fragment " << getName() << ": atoms of inversion"
            << containerToString(inversionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(inversionAtoms)) {
        oss << "Error in Fragment " << getName() << " : atoms of inversion"
            << containerToString(inversionAtoms)
            << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp  = getInversionStamp(i);
      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      inversionAtoms.push_back(inversionStamp->getCenter());
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = inversionAtoms.begin(); j != inversionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Fragment " << getName()
                << ": inversion centered on atom "
                << inversionStamp->getCenter()
                << " has four atoms that belong to same rigidbody "
                << rigidbodyIndex << "\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allInversions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int cent                       = inversionStamp->getCenter();
      std::vector<int> inversion     = inversionStamp->getSatellites();

      std::tuple<int, int, int, int> inversionTuple(cent, inversion[0],
                                                    inversion[1], inversion[2]);
      auto& [first, second, third, fourth] = inversionTuple;

      // In OpenMD, the Central atom in an inversion comes first, and
      // has a special position.  The other three atoms can come in
      // random order, and should be sorted in increasing numerical
      // order to check for duplicates.  This requires three pairwise
      // swaps:
      if (third > fourth) std::swap(third, fourth);
      if (second > third) std::swap(second, third);
      if (third > fourth) std::swap(third, fourth);

      iter = allInversions.find(inversionTuple);
      if (iter == allInversions.end()) {
        allInversions.insert(inversionTuple);
      } else {
        oss << "Error in Fragment " << getName() << ": "
            << "Inversion" << containerToString(inversion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }
  }